

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int P_FindLineSpecial(char *string,int *min_args,int *max_args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_44;
  
  iVar4 = 0;
  iVar3 = 0xf6;
  do {
    if (iVar3 < iVar4) {
      return 0;
    }
    iVar2 = (iVar4 + iVar3) / 2;
    iVar1 = strcasecmp(string,LineSpecialNames[iVar2].name);
    if (iVar1 == 0) {
      if (min_args != (int *)0x0) {
        *min_args = (int)LineSpecialNames[iVar2].min_args;
      }
      if (max_args != (int *)0x0) {
        *max_args = (int)LineSpecialNames[iVar2].max_args;
      }
      local_44 = LineSpecialNames[iVar2].number;
    }
    else if (iVar1 < 1) {
      iVar3 = iVar2 + -1;
    }
    else {
      iVar4 = iVar2 + 1;
    }
  } while (iVar1 != 0);
  return local_44;
}

Assistant:

int P_FindLineSpecial (const char *string, int *min_args, int *max_args)
{
	int min = 0, max = countof(LineSpecialNames) - 1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		int lexval = stricmp (string, LineSpecialNames[mid].name);
		if (lexval == 0)
		{
			if (min_args != NULL) *min_args = LineSpecialNames[mid].min_args;
			if (max_args != NULL) *max_args = LineSpecialNames[mid].max_args;
			return LineSpecialNames[mid].number;
		}
		else if (lexval > 0)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return 0;
}